

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTCTE.cpp
# Opt level: O0

string * __thiscall
glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::
getTessellationEvaluationShaderCode_abi_cxx11_
          (string *__return_storage_ptr__,
          TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize *this,
          bool should_pass_pointsize_data,_tessellation_primitive_mode primitive_mode,
          _tessellation_shader_vertex_ordering vertex_ordering,
          _tessellation_shader_vertex_spacing vertex_spacing,bool is_point_mode_enabled)

{
  ostream *poVar1;
  ulong uVar2;
  string *psVar3;
  char *pcVar4;
  _tessellation_primitive_mode primitive_mode_00;
  _tessellation_shader_vertex_ordering vertex_ordering_00;
  _tessellation_shader_vertex_spacing extraout_EDX;
  _tessellation_shader_vertex_ordering vertex_ordering_01;
  _tessellation_shader_vertex_spacing extraout_EDX_00;
  _tessellation_shader_vertex_spacing vertex_spacing_00;
  _tessellation_shader_vertex_spacing vertex_spacing_01;
  string local_660 [32];
  string local_640;
  stringstream local_620 [8];
  stringstream helper_sstream_1;
  ostream local_610;
  string local_498;
  string local_478 [32];
  string local_458;
  stringstream local_438 [8];
  stringstream helper_sstream;
  ostream local_428;
  string local_2b0;
  ulong local_290;
  size_t vertex_spacing_token_index;
  char *vertex_spacing_token;
  string vertex_spacing_mode_string;
  size_t vertex_ordering_token_index;
  char *vertex_ordering_token;
  string vertex_ordering_string;
  size_t primitive_mode_token_index;
  char *primitive_mode_token;
  string primitive_mode_string;
  size_t point_mode_token_index;
  char *point_mode_token;
  byte local_1b9;
  stringstream local_1b8 [8];
  stringstream result_sstream;
  ostream local_1a8;
  undefined1 local_29;
  _tessellation_shader_vertex_spacing local_28;
  _tessellation_shader_vertex_ordering _Stack_24;
  bool is_point_mode_enabled_local;
  _tessellation_shader_vertex_spacing vertex_spacing_local;
  _tessellation_shader_vertex_ordering vertex_ordering_local;
  _tessellation_primitive_mode primitive_mode_local;
  bool should_pass_pointsize_data_local;
  TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize *this_local;
  string *result;
  
  local_29 = is_point_mode_enabled;
  local_28 = vertex_spacing;
  _Stack_24 = vertex_ordering;
  vertex_spacing_local = primitive_mode;
  vertex_ordering_local._3_1_ = should_pass_pointsize_data;
  _primitive_mode_local = this;
  this_local = (TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize *)
               __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_1b9 = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::operator<<(&local_1a8,"${VERSION}\n\n${TESSELLATION_SHADER_REQUIRE}\n");
  if ((vertex_ordering_local._3_1_ & 1) != TESSELLATION_SHADER_VERTEX_ORDERING_CCW >> 0x18) {
    std::operator<<(&local_1a8,"${TESSELLATION_POINT_SIZE_REQUIRE}\n");
  }
  std::operator<<(&local_1a8,
                  "\nlayout (TESSELLATOR_PRIMITIVE_MODE VERTEX_SPACING_MODE VERTEX_ORDERING POINT_MODE) in;\n\n"
                 );
  if ((vertex_ordering_local._3_1_ & 1) == TESSELLATION_SHADER_VERTEX_ORDERING_CCW >> 0x18) {
    std::operator<<(&local_1a8,"${IN_PER_VERTEX_DECL}");
    std::operator<<(&local_1a8,"${OUT_PER_VERTEX_DECL}");
  }
  else {
    std::operator<<(&local_1a8,"${IN_PER_VERTEX_DECL_POINT_SIZE}");
    std::operator<<(&local_1a8,"${OUT_PER_VERTEX_DECL_POINT_SIZE}");
  }
  std::operator<<(&local_1a8,"in OUT_TC\n{\n     vec2 value1;\n    ivec4 value2;\n} tc_data[];\n\n")
  ;
  if ((vertex_ordering_local._3_1_ & 1) != TESSELLATION_SHADER_VERTEX_ORDERING_CCW >> 0x18) {
    std::operator<<(&local_1a8,"out      float te_pointsize;\n");
  }
  std::operator<<(&local_1a8,
                  "out       vec4 te_position;\nout       vec2 te_value1;\nout flat ivec4 te_value2;\n\nvoid main()\n{\n"
                 );
  if ((vertex_ordering_local._3_1_ & 1) != TESSELLATION_SHADER_VERTEX_ORDERING_CCW >> 0x18) {
    std::operator<<(&local_1a8,"    te_pointsize = 0.0;\n");
  }
  poVar1 = std::operator<<(&local_1a8,
                           "    te_position  = vec4 (0.0);\n    te_value1    = vec2 (0.0);\n    te_value2    = ivec4(0);\n\n    for (int n = 0; n < "
                          );
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_gl_max_patch_vertices_value);
  std::operator<<(poVar1,"; ++n)\n    {\n");
  if ((vertex_ordering_local._3_1_ & 1) != TESSELLATION_SHADER_VERTEX_ORDERING_CCW >> 0x18) {
    std::operator<<(&local_1a8,"        te_pointsize += gl_in[n].gl_PointSize;\n");
  }
  std::operator<<(&local_1a8,
                  "        te_position += gl_in  [n].gl_Position;\n        te_value1   += tc_data[n].value1;\n        te_value2   += tc_data[n].value2;\n    }\n}\n"
                 );
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&point_mode_token);
  std::__cxx11::string::~string((string *)&point_mode_token);
  primitive_mode_string.field_2._8_8_ = 0xffffffffffffffff;
  TessellationShaderUtils::getESTokenForPrimitiveMode_abi_cxx11_
            ((string *)&primitive_mode_token,(TessellationShaderUtils *)(ulong)vertex_spacing_local,
             primitive_mode_00);
  vertex_ordering_string.field_2._8_8_ = 0xffffffffffffffff;
  std::__cxx11::string::string((string *)&vertex_ordering_token);
  vertex_spacing_mode_string.field_2._8_8_ = 0xffffffffffffffff;
  std::__cxx11::string::string((string *)&vertex_spacing_token);
  vertex_spacing_token_index = (size_t)anon_var_dwarf_64e9d4;
  local_290 = 0xffffffffffffffff;
  if (_Stack_24 == TESSELLATION_SHADER_VERTEX_ORDERING_DEFAULT) {
    TessellationShaderUtils::getESTokenForVertexOrderingMode_abi_cxx11_
              (&local_2b0,(TessellationShaderUtils *)0x2,vertex_ordering_00);
    std::__cxx11::string::operator=((string *)&vertex_ordering_token,(string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_2b0);
    vertex_spacing_00 = extraout_EDX;
  }
  else {
    std::__cxx11::stringstream::stringstream(local_438);
    poVar1 = std::operator<<(&local_428,", ");
    TessellationShaderUtils::getESTokenForVertexOrderingMode_abi_cxx11_
              (&local_458,(TessellationShaderUtils *)(ulong)_Stack_24,vertex_ordering_01);
    std::operator<<(poVar1,(string *)&local_458);
    std::__cxx11::string::~string((string *)&local_458);
    std::__cxx11::stringstream::str();
    std::__cxx11::string::operator=((string *)&vertex_ordering_token,local_478);
    std::__cxx11::string::~string(local_478);
    std::__cxx11::stringstream::~stringstream(local_438);
    vertex_spacing_00 = extraout_EDX_00;
  }
  if (local_28 == TESSELLATION_SHADER_VERTEX_SPACING_DEFAULT) {
    TessellationShaderUtils::getESTokenForVertexSpacingMode_abi_cxx11_
              (&local_498,(TessellationShaderUtils *)0x3,vertex_spacing_00);
    std::__cxx11::string::operator=((string *)&vertex_spacing_token,(string *)&local_498);
    std::__cxx11::string::~string((string *)&local_498);
  }
  else {
    std::__cxx11::stringstream::stringstream(local_620);
    poVar1 = std::operator<<(&local_610,", ");
    TessellationShaderUtils::getESTokenForVertexSpacingMode_abi_cxx11_
              (&local_640,(TessellationShaderUtils *)(ulong)local_28,vertex_spacing_01);
    std::operator<<(poVar1,(string *)&local_640);
    std::__cxx11::string::~string((string *)&local_640);
    std::__cxx11::stringstream::str();
    std::__cxx11::string::operator=((string *)&vertex_spacing_token,local_660);
    std::__cxx11::string::~string(local_660);
    std::__cxx11::stringstream::~stringstream(local_620);
  }
  while (uVar2 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x2ae8dda),
        uVar2 != 0xffffffffffffffff) {
    vertex_ordering_string.field_2._8_8_ = uVar2;
    psVar3 = (string *)strlen("TESSELLATOR_PRIMITIVE_MODE");
    psVar3 = (string *)std::__cxx11::string::replace((ulong)__return_storage_ptr__,uVar2,psVar3);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,psVar3);
    vertex_ordering_string.field_2._8_8_ =
         std::__cxx11::string::find((char *)__return_storage_ptr__,0x2ae8dda);
  }
  vertex_ordering_string.field_2._8_8_ = 0xffffffffffffffff;
  while (uVar2 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x2ae8df5),
        uVar2 != 0xffffffffffffffff) {
    vertex_spacing_mode_string.field_2._8_8_ = uVar2;
    psVar3 = (string *)strlen("VERTEX_ORDERING");
    psVar3 = (string *)std::__cxx11::string::replace((ulong)__return_storage_ptr__,uVar2,psVar3);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,psVar3);
    vertex_spacing_mode_string.field_2._8_8_ =
         std::__cxx11::string::find((char *)__return_storage_ptr__,0x2ae8df5);
  }
  vertex_spacing_mode_string.field_2._8_8_ = 0xffffffffffffffff;
  while (uVar2 = std::__cxx11::string::find
                           ((char *)__return_storage_ptr__,vertex_spacing_token_index),
        uVar2 != 0xffffffffffffffff) {
    local_290 = uVar2;
    psVar3 = (string *)strlen((char *)vertex_spacing_token_index);
    psVar3 = (string *)std::__cxx11::string::replace((ulong)__return_storage_ptr__,uVar2,psVar3);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,psVar3);
    local_290 = std::__cxx11::string::find
                          ((char *)__return_storage_ptr__,vertex_spacing_token_index);
  }
  local_290 = 0xffffffffffffffff;
  while (uVar2 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x2bf5da1),
        primitive_mode_string.field_2._8_8_ = uVar2, uVar2 != 0xffffffffffffffff) {
    pcVar4 = (char *)strlen("POINT_MODE");
    psVar3 = (string *)std::__cxx11::string::replace((ulong)__return_storage_ptr__,uVar2,pcVar4);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,psVar3);
    primitive_mode_string.field_2._8_8_ =
         std::__cxx11::string::find((char *)__return_storage_ptr__,0x2bf5da1);
  }
  local_1b9 = 1;
  std::__cxx11::string::~string((string *)&vertex_spacing_token);
  std::__cxx11::string::~string((string *)&vertex_ordering_token);
  std::__cxx11::string::~string((string *)&primitive_mode_token);
  if ((local_1b9 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::getTessellationEvaluationShaderCode(
	bool should_pass_pointsize_data, _tessellation_primitive_mode primitive_mode,
	_tessellation_shader_vertex_ordering vertex_ordering, _tessellation_shader_vertex_spacing vertex_spacing,
	bool is_point_mode_enabled)
{
	std::stringstream result_sstream;
	std::string		  result;

	result_sstream << "${VERSION}\n"
					  "\n"
					  "${TESSELLATION_SHADER_REQUIRE}\n";

	if (should_pass_pointsize_data)
	{
		result_sstream << "${TESSELLATION_POINT_SIZE_REQUIRE}\n";
	}

	result_sstream << "\n"
					  "layout (TESSELLATOR_PRIMITIVE_MODE VERTEX_SPACING_MODE VERTEX_ORDERING POINT_MODE) in;\n"
					  "\n";
	if (should_pass_pointsize_data)
	{
		result_sstream << "${IN_PER_VERTEX_DECL_POINT_SIZE}";
		result_sstream << "${OUT_PER_VERTEX_DECL_POINT_SIZE}";
	}
	else
	{
		result_sstream << "${IN_PER_VERTEX_DECL}";
		result_sstream << "${OUT_PER_VERTEX_DECL}";
	}
	result_sstream << "in OUT_TC\n"
					  "{\n"
					  "     vec2 value1;\n"
					  "    ivec4 value2;\n"
					  "} tc_data[];\n"
					  "\n";

	if (should_pass_pointsize_data)
	{
		result_sstream << "out      float te_pointsize;\n";
	}

	result_sstream << "out       vec4 te_position;\n"
					  "out       vec2 te_value1;\n"
					  "out flat ivec4 te_value2;\n"
					  "\n"
					  "void main()\n"
					  "{\n";

	if (should_pass_pointsize_data)
	{
		result_sstream << "    te_pointsize = 0.0;\n";
	}

	result_sstream << "    te_position  = vec4 (0.0);\n"
					  "    te_value1    = vec2 (0.0);\n"
					  "    te_value2    = ivec4(0);\n"
					  "\n"
					  "    for (int n = 0; n < "
				   << m_gl_max_patch_vertices_value << "; ++n)\n"
													   "    {\n";

	if (should_pass_pointsize_data)
	{
		result_sstream << "        te_pointsize += gl_in[n].gl_PointSize;\n";
	}

	result_sstream << "        te_position += gl_in  [n].gl_Position;\n"
					  "        te_value1   += tc_data[n].value1;\n"
					  "        te_value2   += tc_data[n].value2;\n"
					  "    }\n"
					  "}\n";

	result = result_sstream.str();

	/* Replace the tokens */
	const char* point_mode_token		   = "POINT_MODE";
	std::size_t point_mode_token_index	 = std::string::npos;
	std::string primitive_mode_string	  = TessellationShaderUtils::getESTokenForPrimitiveMode(primitive_mode);
	const char* primitive_mode_token	   = "TESSELLATOR_PRIMITIVE_MODE";
	std::size_t primitive_mode_token_index = std::string::npos;
	std::string vertex_ordering_string;
	const char* vertex_ordering_token		= "VERTEX_ORDERING";
	std::size_t vertex_ordering_token_index = std::string::npos;
	std::string vertex_spacing_mode_string;
	const char* vertex_spacing_token	   = "VERTEX_SPACING_MODE";
	std::size_t vertex_spacing_token_index = std::string::npos;

	/* Prepare the vertex ordering token. We need to do this manually, because the default vertex spacing
	 * mode translates to empty string and the shader would fail to compile if we hadn't taken care of the
	 * comma
	 */
	if (vertex_ordering == TESSELLATION_SHADER_VERTEX_ORDERING_DEFAULT)
	{
		vertex_ordering_string = TessellationShaderUtils::getESTokenForVertexOrderingMode(vertex_ordering);
	}
	else
	{
		std::stringstream helper_sstream;

		helper_sstream << ", " << TessellationShaderUtils::getESTokenForVertexOrderingMode(vertex_ordering);

		vertex_ordering_string = helper_sstream.str();
	}

	/* Do the same for vertex spacing token */
	if (vertex_spacing == TESSELLATION_SHADER_VERTEX_SPACING_DEFAULT)
	{
		vertex_spacing_mode_string = TessellationShaderUtils::getESTokenForVertexSpacingMode(vertex_spacing);
	}
	else
	{
		std::stringstream helper_sstream;

		helper_sstream << ", " << TessellationShaderUtils::getESTokenForVertexSpacingMode(vertex_spacing);

		vertex_spacing_mode_string = helper_sstream.str();
	}

	/* Primitive mode */
	while ((primitive_mode_token_index = result.find(primitive_mode_token)) != std::string::npos)
	{
		result = result.replace(primitive_mode_token_index, strlen(primitive_mode_token), primitive_mode_string);

		primitive_mode_token_index = result.find(primitive_mode_token);
	}

	/* Vertex ordering */
	while ((vertex_ordering_token_index = result.find(vertex_ordering_token)) != std::string::npos)
	{
		result = result.replace(vertex_ordering_token_index, strlen(vertex_ordering_token), vertex_ordering_string);

		vertex_ordering_token_index = result.find(vertex_ordering_token);
	}

	/* Vertex spacing */
	while ((vertex_spacing_token_index = result.find(vertex_spacing_token)) != std::string::npos)
	{
		result = result.replace(vertex_spacing_token_index, strlen(vertex_spacing_token), vertex_spacing_mode_string);

		vertex_spacing_token_index = result.find(vertex_spacing_token);
	}

	/* Point mode */
	while ((point_mode_token_index = result.find(point_mode_token)) != std::string::npos)
	{
		result = result.replace(point_mode_token_index, strlen(point_mode_token),
								(is_point_mode_enabled) ? ", point_mode" : "");

		point_mode_token_index = result.find(point_mode_token);
	}

	return result;
}